

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O3

void EverCrypt_Hash_Incremental_hash
               (Spec_Hash_Definitions_hash_alg a,uint8_t *output,uint8_t *input,uint32_t input_len)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  undefined1 totlen [16];
  undefined1 prev [16];
  undefined1 totlen_00 [16];
  undefined1 prev_00 [16];
  _Bool _Var8;
  Lib_IntVector_Intrinsics_vec256 *extraout_RAX;
  Lib_IntVector_Intrinsics_vec256 *st;
  undefined4 in_register_0000000c;
  Lib_IntVector_Intrinsics_vec256 *d;
  long lVar9;
  char cVar10;
  char extraout_DL;
  uint32_t uVar11;
  undefined8 uVar12;
  uint64_t prev_01;
  uint8_t *output_00;
  uint len;
  uint32_t *os;
  Spec_Hash_Definitions_hash_alg a_00;
  undefined7 in_register_00000039;
  uint *puVar13;
  uint *puVar14;
  uint in_R8D;
  uint64_t *hash;
  byte bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  uint64_t auStack_120 [23];
  uint32_t local_58 [10];
  ulong extraout_RDX;
  
  puVar13 = (uint *)CONCAT71(in_register_00000039,a);
  st = (Lib_IntVector_Intrinsics_vec256 *)CONCAT44(in_register_0000000c,input_len);
  bVar15 = 0;
  switch((ulong)puVar13 & 0xffffffff) {
  case 0:
    local_58[0] = 0xc1059ed8;
    local_58[1] = 0x367cd507;
    local_58[2] = 0x3070dd17;
    local_58[3] = 0xf70e5939;
    local_58[4] = 0xffc00b31;
    local_58[5] = 0x68581511;
    local_58[6] = 0x64f98fa7;
    local_58[7] = 0xbefa4fa4;
    uVar11 = (input_len >> 6) - (uint)(0x3f < input_len && (input_len & 0x3f) == 0);
    len = input_len + uVar11 * -0x40;
    EverCrypt_Hash_update_multi_256(local_58,input,uVar11);
    Hacl_Hash_SHA2_sha224_update_last
              ((ulong)(uVar11 * 0x40) + (ulong)len,len,input + uVar11 * 0x40,local_58);
    Hacl_Hash_SHA2_sha224_finish(local_58,output);
    return;
  case 1:
    EverCrypt_Hash_Incremental_hash_256(output,input,input_len);
    return;
  case 2:
    Hacl_Hash_SHA2_hash_384(output,input,input_len);
    return;
  case 3:
    Hacl_Hash_SHA2_hash_512(output,input,input_len);
    return;
  case 4:
    Hacl_Hash_SHA1_hash_oneshot(output,input,input_len);
    return;
  case 5:
    Hacl_Hash_MD5_hash_oneshot(output,input,input_len);
    return;
  case 6:
    _Var8 = EverCrypt_AutoConfig2_has_vec128();
    if (_Var8) {
      Hacl_Hash_Blake2s_Simd128_hash_with_key(output,0x20,input,input_len,(uint8_t *)0x0,0);
      return;
    }
    Hacl_Hash_Blake2s_hash_with_key(output,0x20,input,input_len,(uint8_t *)0x0,0);
    return;
  case 7:
    _Var8 = EverCrypt_AutoConfig2_has_vec256();
    if (_Var8) {
      Hacl_Hash_Blake2b_Simd256_hash_with_key(output,0x40,input,input_len,(uint8_t *)0x0,0);
      return;
    }
    Hacl_Hash_Blake2b_hash_with_key(output,0x40,input,input_len,(uint8_t *)0x0,0);
    return;
  case 8:
    Hacl_Hash_SHA3_sha3_256(output,input,input_len);
    return;
  case 9:
    Hacl_Hash_SHA3_sha3_224(output,input,input_len);
    return;
  case 10:
    Hacl_Hash_SHA3_sha3_384(output,input,input_len);
    return;
  case 0xb:
    Hacl_Hash_SHA3_sha3_512(output,input,input_len);
    return;
  }
  EverCrypt_Hash_Incremental_hash_cold_1();
  cVar10 = (char)extraout_RDX;
  puVar14 = &switchD_00175c52::switchdataD_001dc548;
  switch((ulong)puVar13 & 0xff) {
  case 0:
    if (cVar10 != '\0') {
      uVar12 = 0x388;
      goto LAB_00175eb9;
    }
    goto LAB_00175d8d;
  case 1:
    if (cVar10 != '\x01') {
      uVar12 = 0x398;
      goto LAB_00175eb9;
    }
    *(int *)(*st + 2) = (int)(*(Lib_IntVector_Intrinsics_vec256 *)output)[2];
LAB_00175d8d:
    uVar16 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
    uVar17 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 4);
    uVar18 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
    uVar19 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0xc);
LAB_00175e2b:
    *(undefined4 *)*st = uVar16;
    *(undefined4 *)((long)*st + 4) = uVar17;
    *(undefined4 *)(*st + 1) = uVar18;
    *(undefined4 *)((long)*st + 0xc) = uVar19;
    return;
  case 2:
    if (cVar10 != '\x02') {
      uVar12 = 0x3a8;
      goto LAB_00175eb9;
    }
    goto LAB_00175d4a;
  case 3:
    if (cVar10 != '\x03') {
      uVar12 = 0x3b8;
      goto LAB_00175eb9;
    }
LAB_00175d4a:
    uVar16 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
    uVar17 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 4);
    uVar18 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
    uVar19 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0xc);
    uVar20 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[2];
    uVar21 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x14);
    uVar22 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[3];
    uVar23 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x1c);
LAB_00175e27:
    *(undefined4 *)(*st + 2) = uVar20;
    *(undefined4 *)((long)*st + 0x14) = uVar21;
    *(undefined4 *)(*st + 3) = uVar22;
    *(undefined4 *)((long)*st + 0x1c) = uVar23;
    goto LAB_00175e2b;
  case 4:
    if (cVar10 != '\x04') {
      uVar12 = 0x3c8;
      goto LAB_00175eb9;
    }
    goto LAB_00175e10;
  case 5:
    if (cVar10 != '\x05') {
      uVar12 = 0x3d8;
      goto LAB_00175eb9;
    }
LAB_00175e10:
    uVar16 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
    uVar17 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 4);
    uVar18 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
    uVar19 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0xc);
    uVar20 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[2];
    uVar21 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x14);
    uVar22 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[3];
    uVar23 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x1c);
    lVar1 = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[0];
    lVar2 = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[1];
    lVar3 = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[3];
    st[1][2] = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[2];
    st[1][3] = lVar3;
    st[1][0] = lVar1;
    st[1][1] = lVar2;
    goto LAB_00175e27;
  case 6:
    if (cVar10 != '\x06') {
      uVar12 = 1000;
      goto LAB_00175eb9;
    }
    goto LAB_00175e35;
  case 7:
    if (cVar10 == '\a') goto LAB_00175e35;
    uVar12 = 0x3f8;
    goto LAB_00175eb9;
  case 8:
    if (cVar10 == '\b') goto LAB_00175e35;
    uVar12 = 0x408;
    goto LAB_00175eb9;
  case 9:
    goto switchD_00175c52_caseD_9;
  case 10:
    if (cVar10 == '\v') {
      Hacl_Hash_Blake2s_Simd128_load_state128s_from_state32
                ((Lib_IntVector_Intrinsics_vec128 *)st,(uint32_t *)output);
      return;
    }
    d = (Lib_IntVector_Intrinsics_vec256 *)(extraout_RDX & 0xff);
    if ((int)d == 10) goto LAB_00175e10;
    goto LAB_00175ed9;
  case 0xb:
    if (cVar10 == '\n') {
      Hacl_Hash_Blake2s_Simd128_store_state128s_to_state32
                ((uint32_t *)st,(Lib_IntVector_Intrinsics_vec128 *)output);
      return;
    }
    d = (Lib_IntVector_Intrinsics_vec256 *)(extraout_RDX & 0xff);
    if ((int)d == 0xb) {
      lVar1 = (*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
      lVar2 = (*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
      lVar3 = (*(Lib_IntVector_Intrinsics_vec256 *)output)[2];
      lVar4 = (*(Lib_IntVector_Intrinsics_vec256 *)output)[3];
      lVar5 = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[0];
      lVar6 = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[1];
      lVar7 = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[3];
      st[1][2] = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[2];
      st[1][3] = lVar7;
      st[1][0] = lVar5;
      st[1][1] = lVar6;
      (*st)[2] = lVar3;
      (*st)[3] = lVar4;
      (*st)[0] = lVar1;
      (*st)[1] = lVar2;
      return;
    }
    goto LAB_00175ecf;
  case 0xc:
    if (cVar10 == '\r') {
      Hacl_Hash_Blake2b_Simd256_load_state256b_from_state32(st,(uint64_t *)output);
      return;
    }
    if (((uint)extraout_RDX & 0xff) == 0xc) {
LAB_00175dce:
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        (*st)[0] = (*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
        output = (uint8_t *)((long)output + ((ulong)bVar15 * -2 + 1) * 8);
        st = (Lib_IntVector_Intrinsics_vec256 *)((long)st + ((ulong)bVar15 * -2 + 1) * 8);
      }
      return;
    }
    copy_cold_3();
    st = extraout_RAX;
    cVar10 = extraout_DL;
    goto switchD_00175c52_caseD_9;
  case 0xd:
    if (cVar10 == '\f') {
      Hacl_Hash_Blake2b_Simd256_store_state256b_to_state32
                ((uint64_t *)st,(Lib_IntVector_Intrinsics_vec256 *)output);
      return;
    }
    d = (Lib_IntVector_Intrinsics_vec256 *)(extraout_RDX & 0xff);
    if ((int)d == 0xd) goto LAB_00175dce;
    goto LAB_00175ed4;
  default:
    copy_cold_5();
    d = st;
    puVar14 = puVar13;
LAB_00175ecf:
    copy_cold_2();
LAB_00175ed4:
    copy_cold_1();
LAB_00175ed9:
    copy_cold_4();
    bVar15 = (byte)puVar14;
    if (0xd < bVar15) {
      update_last_cold_1();
      switch(bVar15) {
      case 0:
        Hacl_Hash_MD5_finish((uint32_t *)output,output_00);
        return;
      case 1:
        Hacl_Hash_SHA1_finish((uint32_t *)output,output_00);
        return;
      case 2:
        Hacl_Hash_SHA2_sha224_finish((uint32_t *)output,output_00);
        return;
      case 3:
        Hacl_Hash_SHA2_sha256_finish((uint32_t *)output,output_00);
        return;
      case 4:
        Hacl_Hash_SHA2_sha384_finish((uint64_t *)output,output_00);
        return;
      case 5:
        Hacl_Hash_SHA2_sha512_finish((uint64_t *)output,output_00);
        return;
      case 6:
        uVar16 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
        uVar17 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 4);
        uVar18 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
        uVar19 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0xc);
        lVar1 = (*(Lib_IntVector_Intrinsics_vec256 *)output)[2];
        *(int *)(output_00 + 0x18) = (int)(*(Lib_IntVector_Intrinsics_vec256 *)output)[3];
        *(longlong *)(output_00 + 0x10) = lVar1;
        goto LAB_00176199;
      case 7:
        uVar16 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
        uVar17 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 4);
        uVar18 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
        uVar19 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0xc);
        uVar20 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[2];
        uVar21 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x14);
        uVar22 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[3];
        uVar23 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x1c);
        goto LAB_00176195;
      case 8:
        uVar16 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
        uVar17 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 4);
        uVar18 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
        uVar19 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0xc);
        uVar20 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[2];
        uVar21 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x14);
        uVar22 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[3];
        uVar23 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x1c);
        uVar24 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[0];
        uVar25 = *(undefined4 *)
                  ((long)*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20) + 4);
        uVar26 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[1];
        uVar27 = *(undefined4 *)
                  ((long)*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20) + 0xc);
        break;
      case 9:
        uVar16 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[0];
        uVar17 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 4);
        uVar18 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[1];
        uVar19 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0xc);
        uVar20 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[2];
        uVar21 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x14);
        uVar22 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)output)[3];
        uVar23 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)output + 0x1c);
        uVar24 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[0];
        uVar25 = *(undefined4 *)
                  ((long)*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20) + 4);
        uVar26 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[1];
        uVar27 = *(undefined4 *)
                  ((long)*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20) + 0xc);
        lVar1 = (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[3];
        *(longlong *)(output_00 + 0x30) =
             (*(Lib_IntVector_Intrinsics_vec256 *)((long)output + 0x20))[2];
        *(longlong *)(output_00 + 0x38) = lVar1;
        break;
      case 10:
        Hacl_Hash_Blake2s_finish(0x20,output_00,(uint32_t *)output);
        return;
      case 0xb:
        Hacl_Hash_Blake2s_Simd128_finish(0x20,output_00,(Lib_IntVector_Intrinsics_vec128 *)output);
        return;
      case 0xc:
        Hacl_Hash_Blake2b_finish(0x40,output_00,(uint64_t *)output);
        return;
      case 0xd:
        Hacl_Hash_Blake2b_Simd256_finish(0x40,output_00,(Lib_IntVector_Intrinsics_vec256 *)output);
        return;
      default:
        finish_cold_1();
        return;
      }
      *(undefined4 *)(output_00 + 0x20) = uVar24;
      *(undefined4 *)(output_00 + 0x24) = uVar25;
      *(undefined4 *)(output_00 + 0x28) = uVar26;
      *(undefined4 *)(output_00 + 0x2c) = uVar27;
LAB_00176195:
      *(undefined4 *)(output_00 + 0x10) = uVar20;
      *(undefined4 *)(output_00 + 0x14) = uVar21;
      *(undefined4 *)(output_00 + 0x18) = uVar22;
      *(undefined4 *)(output_00 + 0x1c) = uVar23;
LAB_00176199:
      *(undefined4 *)output_00 = uVar16;
      *(undefined4 *)(output_00 + 4) = uVar17;
      *(undefined4 *)(output_00 + 8) = uVar18;
      *(undefined4 *)(output_00 + 0xc) = uVar19;
      return;
    }
  }
  hash = (uint64_t *)(ulong)in_R8D;
  uVar11 = (uint32_t)prev_01;
  switch((ulong)puVar14 & 0xff) {
  case 0:
    Hacl_Hash_MD5_update_last((uint32_t *)output,prev_01,(uint8_t *)d,in_R8D);
    break;
  case 1:
    Hacl_Hash_SHA1_update_last((uint32_t *)output,prev_01,(uint8_t *)d,in_R8D);
    break;
  case 2:
    Hacl_Hash_SHA2_sha224_update_last((long)hash + prev_01,in_R8D,(uint8_t *)d,(uint32_t *)output);
    break;
  case 3:
    Hacl_Hash_SHA2_sha256_update_last((long)hash + prev_01,in_R8D,(uint8_t *)d,(uint32_t *)output);
    break;
  case 4:
    totlen._8_8_ = in_stack_fffffffffffffec8;
    totlen._0_8_ = in_stack_fffffffffffffec0;
    Hacl_Hash_SHA2_sha384_update_last
              ((FStar_UInt128_uint128)totlen,in_R8D + uVar11,
               (uint8_t *)(ulong)CARRY8((ulong)hash,prev_01),hash);
    break;
  case 5:
    totlen_00._8_8_ = in_stack_fffffffffffffec8;
    totlen_00._0_8_ = in_stack_fffffffffffffec0;
    Hacl_Hash_SHA2_sha512_update_last
              ((FStar_UInt128_uint128)totlen_00,in_R8D + uVar11,
               (uint8_t *)(ulong)CARRY8((ulong)hash,prev_01),hash);
    break;
  case 6:
    a_00 = '\t';
    goto LAB_0017609a;
  case 7:
    a_00 = '\b';
    goto LAB_0017609a;
  case 8:
    a_00 = '\n';
    goto LAB_0017609a;
  case 9:
    a_00 = '\v';
LAB_0017609a:
    Hacl_Hash_SHA3_update_last_sha3(a_00,(uint64_t *)output,(uint8_t *)d,in_R8D);
    break;
  case 10:
    auStack_120[6] = 0;
    auStack_120[7] = 0;
    auStack_120[4] = 0;
    auStack_120[5] = 0;
    auStack_120[2] = 0;
    auStack_120[3] = 0;
    auStack_120[0] = 0;
    auStack_120[1] = 0;
    Hacl_Hash_Blake2s_update_last
              (in_R8D,(uint32_t *)auStack_120,(uint32_t *)output,prev_01,in_R8D,(uint8_t *)d);
    break;
  case 0xb:
    auStack_120[6] = 0;
    auStack_120[7] = 0;
    auStack_120[4] = 0;
    auStack_120[5] = 0;
    auStack_120[2] = 0;
    auStack_120[3] = 0;
    auStack_120[0] = 0;
    auStack_120[1] = 0;
    Hacl_Hash_Blake2s_Simd128_update_last
              (in_R8D,(Lib_IntVector_Intrinsics_vec128 *)auStack_120,
               (Lib_IntVector_Intrinsics_vec128 *)output,prev_01,in_R8D,(uint8_t *)d);
    break;
  case 0xc:
    auStack_120[0xe] = 0;
    auStack_120[0xf] = 0;
    auStack_120[0xc] = 0;
    auStack_120[0xd] = 0;
    auStack_120[10] = 0;
    auStack_120[0xb] = 0;
    auStack_120[8] = 0;
    auStack_120[9] = 0;
    auStack_120[6] = 0;
    auStack_120[7] = 0;
    auStack_120[4] = 0;
    auStack_120[5] = 0;
    auStack_120[2] = 0;
    auStack_120[3] = 0;
    auStack_120[0] = 0;
    auStack_120[1] = 0;
    prev._8_8_ = in_stack_fffffffffffffec8;
    prev._0_8_ = d;
    Hacl_Hash_Blake2b_update_last
              (in_R8D,auStack_120,(uint64_t *)output,(FStar_UInt128_uint128)prev,uVar11,
               (uint8_t *)0x0);
    break;
  case 0xd:
    auStack_120[0xe] = 0;
    auStack_120[0xf] = 0;
    auStack_120[0xc] = 0;
    auStack_120[0xd] = 0;
    auStack_120[10] = 0;
    auStack_120[0xb] = 0;
    auStack_120[8] = 0;
    auStack_120[9] = 0;
    auStack_120[6] = 0;
    auStack_120[7] = 0;
    auStack_120[4] = 0;
    auStack_120[5] = 0;
    auStack_120[2] = 0;
    auStack_120[3] = 0;
    auStack_120[0] = 0;
    auStack_120[1] = 0;
    prev_00._8_8_ = in_stack_fffffffffffffec8;
    prev_00._0_8_ = d;
    Hacl_Hash_Blake2b_Simd256_update_last
              (in_R8D,(Lib_IntVector_Intrinsics_vec256 *)auStack_120,
               (Lib_IntVector_Intrinsics_vec256 *)output,(FStar_UInt128_uint128)prev_00,uVar11,
               (uint8_t *)0x0);
  }
  return;
switchD_00175c52_caseD_9:
  if (cVar10 == '\t') {
LAB_00175e35:
    memcpy(st,output,200);
    return;
  }
  uVar12 = 0x418;
LAB_00175eb9:
  printf("KaRaMeL abort at %s:%d\n%s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_Hash.c"
         ,uVar12,"unreachable (pattern matches are exhaustive in F*)");
  exit(0xff);
}

Assistant:

void
EverCrypt_Hash_Incremental_hash(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *output,
  uint8_t *input,
  uint32_t input_len
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_MD5:
      {
        Hacl_Hash_MD5_hash_oneshot(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA1:
      {
        Hacl_Hash_SHA1_hash_oneshot(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_224:
      {
        hash_224(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        EverCrypt_Hash_Incremental_hash_256(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        Hacl_Hash_SHA2_hash_384(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        Hacl_Hash_SHA2_hash_512(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_224:
      {
        Hacl_Hash_SHA3_sha3_224(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_256:
      {
        Hacl_Hash_SHA3_sha3_256(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_384:
      {
        Hacl_Hash_SHA3_sha3_384(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_512:
      {
        Hacl_Hash_SHA3_sha3_512(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        #if HACL_CAN_COMPILE_VEC128
        bool vec128 = EverCrypt_AutoConfig2_has_vec128();
        if (vec128)
        {
          Hacl_Hash_Blake2s_Simd128_hash_with_key(output, 32U, input, input_len, NULL, 0U);
          return;
        }
        Hacl_Hash_Blake2s_hash_with_key(output, 32U, input, input_len, NULL, 0U);
        #else
        Hacl_Hash_Blake2s_hash_with_key(output, 32U, input, input_len, NULL, 0U);
        #endif
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        #if HACL_CAN_COMPILE_VEC256
        bool vec256 = EverCrypt_AutoConfig2_has_vec256();
        if (vec256)
        {
          Hacl_Hash_Blake2b_Simd256_hash_with_key(output, 64U, input, input_len, NULL, 0U);
          return;
        }
        Hacl_Hash_Blake2b_hash_with_key(output, 64U, input, input_len, NULL, 0U);
        #else
        Hacl_Hash_Blake2b_hash_with_key(output, 64U, input, input_len, NULL, 0U);
        #endif
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}